

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,
          InterpreterStackFrame *newInstance,ScriptContext *scriptContext,bool fromLoopBody,
          Var *registerSaves,BailOutReturnValue *bailOutReturnValue,Var *pArgumentsObject,
          Var branchValue,void *returnAddress,bool useStartCall,void *argoutRestoreAddress)

{
  uint uVar1;
  code *pcVar2;
  anon_class_32_4_9e2aaefe callback;
  bool bVar3;
  ArgSlot AVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  RegSlot RVar7;
  FunctionBody *pFVar8;
  undefined4 *puVar9;
  ScriptFunction *pSVar10;
  ThreadContext *this_00;
  Var *__s;
  uint uStack_b4;
  bool hasArgumentSlot;
  uint startCallOutParamCount;
  uint i_1;
  void *argRestoreAddr;
  uint outParamSlot;
  uint i;
  FunctionBody *functionBody;
  AutoPushReturnAddressForStackWalker local_68;
  AutoPushReturnAddressForStackWalker saveReturnAddress;
  bool useStartCall_local;
  bool fromLoopBody_local;
  ScriptContext *scriptContext_local;
  InterpreterStackFrame *newInstance_local;
  JavascriptCallStackLayout *layout_local;
  BailOutKind bailOutKind_local;
  BailOutRecord *this_local;
  
  saveReturnAddress.m_scriptContext._6_1_ = useStartCall;
  saveReturnAddress.m_scriptContext._7_1_ = fromLoopBody;
  Js::AutoPushReturnAddressForStackWalker::AutoPushReturnAddressForStackWalker
            (&local_68,scriptContext,returnAddress);
  if (this->stackLiteralBailOutRecordCount != 0) {
    callback.layout = layout;
    callback.this = this;
    callback.registerSaves._0_4_ = (int)registerSaves;
    callback.registerSaves._4_4_ = (int)((ulong)registerSaves >> 0x20);
    callback.scriptContext = scriptContext;
    GlobalBailOutRecordDataTable::
    IterateGlobalBailOutRecordTableRows<BailOutRecord::RestoreValues(IR::BailOutKind,Js::JavascriptCallStackLayout*,Js::InterpreterStackFrame*,Js::ScriptContext*,bool,void**,BailOutRecord::BailOutReturnValue*,void**,void*,void*,bool,void*)const::__0>
              (this->globalBailOutRecordTable,this->m_bailOutRecordId,callback);
  }
  if (this->localOffsetsCount != 0) {
    pFVar8 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if ((DAT_01ec73ca & 1) != 0) {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar3) &&
         ((bVar3 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar3 ||
          (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar3)))) {
        Output::Print(L"BailOut:   Register #%3d: Not live\n",0);
      }
    }
    for (argRestoreAddr._4_4_ = 1; RVar7 = Js::FunctionBody::GetConstantCount(pFVar8),
        argRestoreAddr._4_4_ < RVar7; argRestoreAddr._4_4_ = argRestoreAddr._4_4_ + 1) {
      if ((DAT_01ec73ca & 1) != 0) {
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
        if ((bVar3) &&
           ((bVar3 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar3 ||
            (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar3)))) {
          Output::Print(L"BailOut:   Register #%3d: Constant table\n",(ulong)argRestoreAddr._4_4_);
        }
      }
    }
    bVar3 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar8);
    if (bVar3) {
      pSVar10 = Js::InterpreterStackFrame::GetJavascriptFunction(newInstance);
      AdjustOffsetsForDiagMode(this,layout,pSVar10);
    }
    RestoreValues(this,bailOutKind,layout,this->localOffsetsCount,(int *)0x0,0,
                  (Var *)(newInstance + 0x160),scriptContext,
                  (bool)(saveReturnAddress.m_scriptContext._7_1_ & 1),registerSaves,newInstance,
                  pArgumentsObject,(void *)0x0);
  }
  if (((saveReturnAddress.m_scriptContext._6_1_ & 1) != 0) &&
     (this->argOutOffsetInfo != (ArgOutOffsetInfo *)0x0)) {
    argRestoreAddr._0_4_ = 0;
    for (uStack_b4 = 0; uStack_b4 < this->argOutOffsetInfo->startCallCount;
        uStack_b4 = uStack_b4 + 1) {
      uVar5 = this->argOutOffsetInfo->startCallOutParamCounts[uStack_b4];
      Js::InterpreterStackFrame::OP_StartCall(newInstance,uVar5);
      RestoreValues(this,bailOutKind,layout,uVar5,
                    this->argOutOffsetInfo->outParamOffsets + (uint)argRestoreAddr,
                    this->argOutOffsetInfo->argOutSymStart + (uint)argRestoreAddr,
                    *(Var **)(newInstance + 0x28),scriptContext,
                    (bool)(saveReturnAddress.m_scriptContext._7_1_ & 1),registerSaves,newInstance,
                    pArgumentsObject,(void *)0x0);
      argRestoreAddr._0_4_ = uVar5 + (uint)argRestoreAddr;
    }
  }
  if ((*(long *)(newInstance + 0x80) == 0) ||
     (pFVar8 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80))
     , pFVar8 == (FunctionBody *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x2fc,"(newInstance->function && newInstance->function->GetFunctionBody())",
                       "newInstance->function && newInstance->function->GetFunctionBody()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = false;
  if ((saveReturnAddress.m_scriptContext._7_1_ & 1) == 0) {
    pFVar8 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    AVar4 = Js::ParseableFunctionInfo::GetInParamsCount(&pFVar8->super_ParseableFunctionInfo);
    bVar3 = AVar4 != 0;
  }
  if ((bVar3) && (*(long *)(newInstance + 0x40) == 0)) {
    *(Var *)(newInstance + 0x40) = *pArgumentsObject;
  }
  if ((bailOutReturnValue != (BailOutReturnValue *)0x0) &&
     (bailOutReturnValue->returnValueRegSlot != 0xffffffff)) {
    if (bailOutReturnValue->returnValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x306,"(bailOutReturnValue->returnValue != nullptr)",
                         "bailOutReturnValue->returnValue != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    uVar1 = bailOutReturnValue->returnValueRegSlot;
    pSVar10 = Js::InterpreterStackFrame::GetJavascriptFunction(newInstance);
    pFVar8 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar10);
    RVar7 = Js::FunctionBody::GetLocalsCount(pFVar8);
    if (RVar7 <= uVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x307,
                         "(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    *(Var *)(newInstance + (ulong)bailOutReturnValue->returnValueRegSlot * 8 + 0x160) =
         bailOutReturnValue->returnValue;
    if ((DAT_01ec73ca & 1) != 0) {
      pFVar8 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80))
      ;
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
      pFVar8 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80))
      ;
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar3) &&
         ((bVar3 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar3 ||
          (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar3)))) {
        Output::Print(L"BailOut:   Register #%3d: Return, value: 0x%p\n",
                      (ulong)bailOutReturnValue->returnValueRegSlot,bailOutReturnValue->returnValue)
        ;
      }
    }
  }
  if (this->branchValueRegSlot != 0xffffffff) {
    if ((branchValue == (Var)0x0) || (bVar3 = Js::VarIs<Js::JavascriptBoolean>(branchValue), !bVar3)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x311,"(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue))",
                         "branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    uVar1 = this->branchValueRegSlot;
    pSVar10 = Js::InterpreterStackFrame::GetJavascriptFunction(newInstance);
    pFVar8 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar10);
    RVar7 = Js::FunctionBody::GetLocalsCount(pFVar8);
    if (RVar7 <= uVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x312,
                         "(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    *(Var *)(newInstance + (ulong)this->branchValueRegSlot * 8 + 0x160) = branchValue;
  }
  this_00 = Js::ScriptContext::GetThreadContext(scriptContext);
  __s = ThreadContext::GetBailOutRegisterSaveSpace(this_00);
  uVar5 = GetBailOutRegisterSaveSlotCount();
  memset(__s,0,(ulong)uVar5 << 3);
  Js::AutoPushReturnAddressForStackWalker::~AutoPushReturnAddressForStackWalker(&local_68);
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::InterpreterStackFrame * newInstance,
    Js::ScriptContext * scriptContext, bool fromLoopBody, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * returnAddress, bool useStartCall /* = true */, void * argoutRestoreAddress) const
{
    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(scriptContext, returnAddress);

    if (this->stackLiteralBailOutRecordCount)
    {
        // Null out the field on the stack literal that hasn't fully initialized yet.

        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow  *row)
        {
            for (uint i = 0; i < this->stackLiteralBailOutRecordCount; i++)
            {
                BailOutRecord::StackLiteralBailOutRecord& record = this->stackLiteralBailOutRecord[i];

                if (record.regSlot == row->regSlot)
                {
                    // Partially initialized stack literal shouldn't be type specialized yet.
                    Assert(!row->isFloat);
                    Assert(!row->isInt);

                    int offset = row->offset;
                    Js::Var value;
                    if (offset < 0)
                    {
                        // Stack offset
                        value = layout->GetOffset(offset);
                    }
                    else
                    {
                        // The value is in register
                        // Index is one based, so subtract one
                        Assert((uint)offset <= GetBailOutRegisterSaveSlotCount());
                        Js::Var * registerSaveSpace = registerSaves ? registerSaves : (Js::Var *)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace();
                        Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                        value = registerSaveSpace[offset - 1];
                    }
                    Assert(Js::DynamicObject::IsBaseDynamicObject(value));
                    Assert(ThreadContext::IsOnStack(value));

                    Js::DynamicObject * obj = Js::VarTo<Js::DynamicObject>(value);
                    uint propertyCount = obj->GetPropertyCount();
                    for (uint j = record.initFldCount; j < propertyCount; j++)
                    {
                        obj->SetSlot(SetSlotArgumentsRoot(Js::Constants::NoProperty, false, j, nullptr));
                    }
                }
            }
        });
    }

    if (this->localOffsetsCount)
    {
        Js::FunctionBody* functionBody = newInstance->function->GetFunctionBody();
#if ENABLE_DEBUG_CONFIG_OPTIONS
        BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Not live\n"), 0);

        for (uint i = 1; i < functionBody->GetConstantCount(); i++)
        {
            BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Constant table\n"), i);
        }
#endif

        if (functionBody->IsInDebugMode())
        {
            this->AdjustOffsetsForDiagMode(layout, newInstance->GetJavascriptFunction());
        }

        this->RestoreValues(bailOutKind, layout, this->localOffsetsCount,
            nullptr, 0, newInstance->m_localSlots, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject);
    }

    if (useStartCall && this->argOutOffsetInfo)
    {
        uint outParamSlot = 0;
        void * argRestoreAddr = nullptr;
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
#ifdef _M_IX86
            if (argoutRestoreAddress)
            {
                argRestoreAddr = (void*)((char*)argoutRestoreAddress + (this->startCallArgRestoreAdjustCounts[i] * MachPtr));
            }
#endif
            newInstance->OP_StartCall(startCallOutParamCount);
            this->RestoreValues(bailOutKind, layout, startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot],
                this->argOutOffsetInfo->argOutSymStart + outParamSlot, newInstance->m_outParams,
                scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject, argRestoreAddr);
            outParamSlot += startCallOutParamCount;
        }
    }

    // If we're not in a loop body, then the arguments object is not on the local frame.
    // If the RestoreValues created an arguments object for us, then it's already on the interpreter instance.
    // Otherwise, we need to propagate the object from the jitted frame to the interpreter.
    Assert(newInstance->function && newInstance->function->GetFunctionBody());
    bool hasArgumentSlot =      // Be consistent with Func::HasArgumentSlot.
        !fromLoopBody && newInstance->function->GetFunctionBody()->GetInParamsCount() != 0;
    if (hasArgumentSlot && newInstance->m_arguments == nullptr)
    {
        newInstance->m_arguments = *pArgumentsObject;
    }

    if (bailOutReturnValue != nullptr && bailOutReturnValue->returnValueRegSlot != Js::Constants::NoRegister)
    {
        Assert(bailOutReturnValue->returnValue != nullptr);
        Assert(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[bailOutReturnValue->returnValueRegSlot] = bailOutReturnValue->returnValue;

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Register #%3d: Return, value: 0x%p\n"),
            bailOutReturnValue->returnValueRegSlot, bailOutReturnValue->returnValue);
    }

    if (branchValueRegSlot != Js::Constants::NoRegister)
    {
        // Used when a t1 = CmCC is optimize to BrCC, and the branch bails out. T1 needs to be restored
        Assert(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue));
        Assert(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[branchValueRegSlot] = branchValue;
    }

#if DBG
    // Clear the register save area for the next bailout
    memset((void*)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace(), 0, GetBailOutRegisterSaveSlotCount() * sizeof(Js::Var));
#endif
}